

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-impl.cpp
# Opt level: O2

string * gguf_data_to_str_abi_cxx11_(string *__return_storage_ptr__,gguf_type type,void *data,int i)

{
  uint __val;
  char *__s;
  allocator<char> local_9;
  
  switch((ulong)type) {
  case 0:
    __val = (uint)*(byte *)((long)data + (long)i);
    goto LAB_001ef7eb;
  case 1:
    __val = (uint)*(char *)((long)data + (long)i);
    goto LAB_001ef7eb;
  case 2:
    __val = (uint)*(ushort *)((long)data + (long)i * 2);
    goto LAB_001ef7eb;
  case 3:
    __val = (uint)*(short *)((long)data + (long)i * 2);
    goto LAB_001ef7eb;
  case 4:
    std::__cxx11::to_string(__return_storage_ptr__,*(uint *)((long)data + (long)i * 4));
    break;
  case 5:
    __val = *(uint *)((long)data + (long)i * 4);
LAB_001ef7eb:
    std::__cxx11::to_string(__return_storage_ptr__,__val);
    break;
  case 6:
    std::__cxx11::to_string(__return_storage_ptr__,*(float *)((long)data + (long)i * 4));
    break;
  case 7:
    __s = "false";
    if (*(char *)((long)data + (long)i) != '\0') {
      __s = "true";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_9);
    break;
  default:
    format_abi_cxx11_(__return_storage_ptr__,"unknown type %d",(ulong)type);
    break;
  case 10:
    std::__cxx11::to_string(__return_storage_ptr__,*(unsigned_long *)((long)data + (long)i * 8));
    break;
  case 0xb:
    std::__cxx11::to_string(__return_storage_ptr__,*(long *)((long)data + (long)i * 8));
    break;
  case 0xc:
    std::__cxx11::to_string(__return_storage_ptr__,*(double *)((long)data + (long)i * 8));
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string gguf_data_to_str(enum gguf_type type, const void * data, int i) {
    switch (type) {
        case GGUF_TYPE_UINT8:   return std::to_string(((const uint8_t  *)data)[i]);
        case GGUF_TYPE_INT8:    return std::to_string(((const int8_t   *)data)[i]);
        case GGUF_TYPE_UINT16:  return std::to_string(((const uint16_t *)data)[i]);
        case GGUF_TYPE_INT16:   return std::to_string(((const int16_t  *)data)[i]);
        case GGUF_TYPE_UINT32:  return std::to_string(((const uint32_t *)data)[i]);
        case GGUF_TYPE_INT32:   return std::to_string(((const int32_t  *)data)[i]);
        case GGUF_TYPE_UINT64:  return std::to_string(((const uint64_t *)data)[i]);
        case GGUF_TYPE_INT64:   return std::to_string(((const int64_t  *)data)[i]);
        case GGUF_TYPE_FLOAT32: return std::to_string(((const float    *)data)[i]);
        case GGUF_TYPE_FLOAT64: return std::to_string(((const double   *)data)[i]);
        case GGUF_TYPE_BOOL:    return ((const bool *)data)[i] ? "true" : "false";
        default:                return format("unknown type %d", type);
    }
}